

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O2

void __thiscall MppEncCfgService::MppEncCfgService(MppEncCfgService *this)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  MppCfgInfo tmp;
  
  this->mTrie = (MppTrie)0x0;
  mpp_env_get_u32("mpp_enc_cfg_debug",&mpp_enc_cfg_debug,0);
  MVar1 = mpp_trie_init(&this->mTrie,"MppEncCfg");
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"mpp_enc_cfg","failed to init enc cfg set trie ret %d\n","MppEncCfgService",
               (ulong)(uint)MVar1);
    return;
  }
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0;
  tmp.flag_value = 1;
  tmp.data_offset = 4;
  RVar2 = 4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"base:low_delay",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 1;
  tmp.data_offset = 0x94;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 4;
  tmp.data_offset = 0x9c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:bps_target",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 4;
  tmp.data_offset = 0xa0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:bps_max",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 4;
  tmp.data_offset = 0xa4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:bps_min",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20;
  tmp.data_offset = 0xa8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_flex",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20;
  tmp.data_offset = 0xac;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_num",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20;
  tmp.data_offset = 0xb0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_denom",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20;
  tmp.data_offset = 0xb0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_denorm",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0xb4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_flex",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0xb8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_num",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0xbc;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_denom",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0xbc;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_denorm",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0xc0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fps_chg_no_idr",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x80;
  tmp.data_offset = 0xc4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:gop",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x10000000;
  tmp.data_offset = 200;
  RVar3 = 8;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"rc:ref_cfg",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x200;
  tmp.data_offset = 0xd4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:max_reenc_times",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0xf4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:priority",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x400;
  tmp.data_offset = 0xdc;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:drop_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x400;
  tmp.data_offset = 0xe0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:drop_thd",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x400;
  tmp.data_offset = 0xe4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:drop_gap",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x800;
  tmp.data_offset = 0x100;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:max_i_prop",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x1000;
  tmp.data_offset = 0x104;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:min_i_prop",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x108;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:init_ip_ratio",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x8000;
  tmp.data_offset = 0xe8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:super_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x8000;
  tmp.data_offset = 0xec;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:super_i_thd",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x8000;
  tmp.data_offset = 0xf0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:super_p_thd",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x1000000;
  tmp.data_offset = 0xf8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:debreath_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x1000000;
  tmp.data_offset = 0xfc;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:debreath_strength",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x10c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_init",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x118;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_min",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x110;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_max",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x11c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_min_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x114;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_max_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x80000;
  tmp.data_offset = 0x120;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_step",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x100000;
  tmp.data_offset = 0x124;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_ip",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x200000;
  tmp.data_offset = 0x128;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:qp_vi",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x2000000;
  tmp.data_offset = 0x140;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:hier_qp_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x2000000;
  tmp.data_offset = 0x144;
  tmp.data_size = 0x10;
  mpp_trie_add_info(this->mTrie,"rc:hier_qp_delta",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x2000000;
  tmp.data_offset = 0x154;
  tmp.data_size = 0x10;
  mpp_trie_add_info(this->mTrie,"rc:hier_frame_num",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x4000000;
  tmp.data_offset = 0xd8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:stats_time",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x8000000;
  tmp.data_offset = 0x164;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:refresh_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x8000000;
  tmp.data_offset = 0x168;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:refresh_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x8000000;
  tmp.data_offset = 0x16c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:refresh_num",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 300;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fqp_min_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 0x130;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fqp_min_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 0x134;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fqp_max_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 0x138;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:fqp_max_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 0x13c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"rc:mt_st_swth_frm_qp",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 1;
  tmp.data_offset = 0xc;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:width",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 1;
  tmp.data_offset = 0x10;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:height",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 1;
  tmp.data_offset = 0x1c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:max_width",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 1;
  tmp.data_offset = 0x20;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:max_height",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 1;
  tmp.data_offset = 0x14;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:hor_stride",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 1;
  tmp.data_offset = 0x18;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:ver_stride",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 4;
  tmp.data_offset = 0x24;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:format",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 4;
  tmp.data_offset = 0x38;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:format_out",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 4;
  tmp.data_offset = 0x3c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:chroma_ds_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 4;
  tmp.data_offset = 0x44;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:fix_chroma_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 4;
  tmp.data_offset = 0x48;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:fix_chroma_u",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 4;
  tmp.data_offset = 0x4c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:fix_chroma_v",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x28;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:colorspace",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x2c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:colorprim",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x80000;
  tmp.data_offset = 0x30;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:colortrc",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x34;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:colorrange",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x34;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:range",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x40;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:range_out",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x10;
  tmp.data_offset = 0x54;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:rotation",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x20;
  tmp.data_offset = 0x5c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:mirroring",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 8;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0x60;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"prep:flip",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0;
  tmp.data_offset = 0x340;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"codec:type",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 1;
  tmp.data_offset = 0x34c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:stream_type",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 2;
  tmp.data_offset = 0x36c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:profile",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 2;
  tmp.data_offset = 0x370;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:level",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x400;
  tmp.data_offset = 0x350;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:poc_type",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x800;
  tmp.data_offset = 0x354;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:log2_max_poc_lsb",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x1000;
  tmp.data_offset = 0x358;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:log2_max_frm_num",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x35c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:gaps_not_allowed",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 4;
  tmp.data_offset = 0x378;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:cabac_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 4;
  tmp.data_offset = 0x380;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:cabac_idc",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x10;
  tmp.data_offset = 0x388;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:trans8x8",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x20;
  tmp.data_offset = 0x38c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:const_intra",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x200;
  tmp.data_offset = 0x390;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:scaling_list",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0x394;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:cb_qp_offset",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0x398;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:cr_qp_offset",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x80;
  tmp.data_offset = 0x39c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:dblk_disable",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x80;
  tmp.data_offset = 0x3a0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:dblk_alpha",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x80;
  tmp.data_offset = 0x3a4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:dblk_beta",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x10c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:qp_init",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x118;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:qp_min",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x110;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:qp_max",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x11c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:qp_min_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x114;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:qp_max_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x80000;
  tmp.data_offset = 0x120;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:qp_step",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x100000;
  tmp.data_offset = 0x124;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:qp_delta_ip",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x400000;
  tmp.data_offset = 0x3c8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:max_tid",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x200000;
  tmp.data_offset = 0x3c4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:max_ltr",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x800000;
  tmp.data_offset = 0x3cc;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:prefix_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x1000000;
  tmp.data_offset = 0x3d0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:base_layer_pid",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 0x3d4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h264:constraint_set",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 1;
  tmp.data_offset = 0x34c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:profile",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 1;
  tmp.data_offset = 0x354;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:tier",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 1;
  tmp.data_offset = 0x350;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:level",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0x41c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:scaling_list",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0x420;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:cb_qp_offset",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0x424;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:cr_qp_offset",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0x428;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:diff_cu_qp_delta_depth",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x1000;
  tmp.data_offset = 0x438;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:dblk_disable",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x1000;
  tmp.data_offset = 0x43c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:dblk_alpha",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x1000;
  tmp.data_offset = 0x440;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:dblk_beta",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x10c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:qp_init",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x118;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:qp_min",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x110;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:qp_max",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x11c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:qp_min_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x114;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:qp_max_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x80000;
  tmp.data_offset = 0x120;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:qp_step",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x100000;
  tmp.data_offset = 0x124;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:qp_delta_ip",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x42c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:sao_luma_disable",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x430;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:sao_chroma_disable",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x434;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:sao_bit_ratio",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x800000;
  tmp.data_offset = 0x458;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:lpf_acs_sli_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x1000000;
  tmp.data_offset = 0x45c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:lpf_acs_tile_disable",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x400000;
  tmp.data_offset = 0x454;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:auto_tile",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x8000000;
  tmp.data_offset = 0x3c8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:max_tid",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x10000000;
  tmp.data_offset = 0x3c4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:max_ltr",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 0x3cc;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:base_layer_pid",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x2000000;
  tmp.data_offset = 0x358;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:const_intra",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 0x4000000;
  tmp.data_offset = 0x360;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"h265:lcu_size",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x10c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:qp_init",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x118;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:qp_min",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x110;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:qp_max",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x11c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:qp_min_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x114;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:qp_max_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x80000;
  tmp.data_offset = 0x120;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:qp_step",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x90;
  tmp.flag_value = 0x100000;
  tmp.data_offset = 0x124;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:qp_delta_ip",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 2;
  tmp.data_offset = 0x368;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"vp8:disable_ivf",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 1;
  tmp.data_offset = 0x34c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"jpeg:quant",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 2;
  tmp.data_offset = 0x360;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"jpeg:qtable_y",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 2;
  tmp.data_offset = 0x368;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"jpeg:qtable_u",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 2;
  tmp.data_offset = 0x370;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"jpeg:qtable_v",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 4;
  tmp.data_offset = 0x350;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"jpeg:q_factor",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 4;
  tmp.data_offset = 0x354;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"jpeg:qf_max",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x348;
  tmp.flag_value = 4;
  tmp.data_offset = 0x358;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"jpeg:qf_min",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0xe90;
  tmp.flag_value = 1;
  tmp.data_offset = 0xe94;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"split:mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0xe90;
  tmp.flag_value = 2;
  tmp.data_offset = 0xe98;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"split:arg",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0xe90;
  tmp.flag_value = 4;
  tmp.data_offset = 0xe9c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"split:out",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 1;
  tmp.data_offset = 0x17c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:qp_row",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 2;
  tmp.data_offset = 0x180;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:qp_row_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 4;
  tmp.data_offset = 0x198;
  RVar3 = 0x40;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"hw:aq_thrd_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 8;
  tmp.data_offset = 0x1d8;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"hw:aq_thrd_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x10;
  tmp.data_offset = 0x218;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"hw:aq_step_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x20;
  tmp.data_offset = 600;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"hw:aq_step_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0x298;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:mb_rc_disable",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x314;
  tmp.data_size = 0x28;
  mpp_trie_add_info(this->mTrie,"hw:aq_rnge_arr",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x100;
  tmp.data_offset = 0x2a0;
  tmp.data_size = 0x20;
  mpp_trie_add_info(this->mTrie,"hw:mode_bias",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x200;
  tmp.data_offset = 0x2c0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:skip_bias_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x200;
  tmp.data_offset = 0x2c4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:skip_sad",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x200;
  tmp.data_offset = 0x2c8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:skip_bias",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x400;
  tmp.data_offset = 0x184;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:qbias_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x800;
  tmp.data_offset = 0x188;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:qbias_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x1000;
  tmp.data_offset = 0x18c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:qbias_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_St;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0x2cc;
  tmp.data_size = 0x48;
  mpp_trie_add_info(this->mTrie,"hw:qbias_arr",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x8000;
  tmp.data_offset = 400;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:flt_str_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x178;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x194;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"hw:flt_str_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 1;
  tmp.data_offset = 0x1864;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:scene_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 2;
  tmp.data_offset = 0x1868;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:deblur_en",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 4;
  tmp.data_offset = 0x186c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:deblur_str",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 8;
  tmp.data_offset = 0x1870;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:anti_flicker_str",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x20;
  tmp.data_offset = 0x1874;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:lambda_idx_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x40;
  tmp.data_offset = 0x1878;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:lambda_idx_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x80;
  tmp.data_offset = 0x187c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:atr_str_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x100;
  tmp.data_offset = 0x1880;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:atr_str_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x200;
  tmp.data_offset = 0x1884;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:atl_str",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x400;
  tmp.data_offset = 0x1888;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:sao_str_i",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x800;
  tmp.data_offset = 0x188c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:sao_str_p",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x1890;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:rc_container",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0x1894;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:vmaf_opt",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x8000;
  tmp.data_offset = 0x1898;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:motion_static_switch_enable",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x189c;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:atf_str",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x18a0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:lgt_chg_lvl",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x18a4;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:static_frm_num",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x80000;
  tmp.data_offset = 0x18a8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:madp16_th",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x100000;
  tmp.data_offset = 0x18ac;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:skip16_wgt",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x200000;
  tmp.data_offset = 0x18b0;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:skip32_wgt",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x1860;
  tmp.flag_value = 0x400000;
  tmp.data_offset = 0x18b8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"tune:speed",&tmp,0x14);
  mpp_trie_add_info(this->mTrie,(char *)0x0,(void *)0x0,0);
  RVar2 = mpp_trie_get_node_count(this->mTrie);
  (this->mHead).node_count = RVar2;
  RVar2 = mpp_trie_get_info_count(this->mTrie);
  (this->mHead).info_count = RVar2;
  RVar2 = mpp_trie_get_buf_size(this->mTrie);
  (this->mHead).info_size = RVar2;
  if (((byte)mpp_enc_cfg_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc_cfg","node cnt: %d\n","MppEncCfgService",
               (ulong)(uint)(this->mHead).node_count);
  }
  return;
}

Assistant:

MppEncCfgService::MppEncCfgService() :
    mTrie(NULL)
{
    MPP_RET ret;

    mpp_env_get_u32("mpp_enc_cfg_debug", &mpp_enc_cfg_debug, 0);

    ret = mpp_trie_init(&mTrie, "MppEncCfg");
    if (ret) {
        mpp_err_f("failed to init enc cfg set trie ret %d\n", ret);
        return ;
    }

    ENTRY_TABLE(EXPAND_AS_TRIE)

    mpp_trie_add_info(mTrie, NULL, NULL, 0);

    mHead.node_count = mpp_trie_get_node_count(mTrie);
    mHead.info_count = mpp_trie_get_info_count(mTrie);
    mHead.info_size = mpp_trie_get_buf_size(mTrie);

    mpp_enc_cfg_dbg_func("node cnt: %d\n", mHead.node_count);
}